

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskContainer.cpp
# Opt level: O2

int __thiscall DataContainer::GetTypeFromFile(DataContainer *this,ITypeManager *manager)

{
  int iVar1;
  FILE *__stream;
  ulong __size;
  void *__ptr;
  string local_50 [32];
  
  iVar1 = GetTypeFromZippedFile(this,manager);
  if (iVar1 == 0) {
    __stream = fopen((this->current_path_)._M_dataplus._M_p,"rb");
    if (__stream == (FILE *)0x0) {
      iVar1 = 0;
    }
    else {
      fseek(__stream,0,2);
      __size = ftell(__stream);
      rewind(__stream);
      __ptr = operator_new__(__size);
      fread(__ptr,__size,1,__stream);
      fclose(__stream);
      iVar1 = (*manager->_vptr_ITypeManager[1])(manager,__ptr,__size & 0xffffffff);
      if (iVar1 == 0) {
        std::__cxx11::string::string(local_50,(string *)&this->current_path_);
        iVar1 = (**manager->_vptr_ITypeManager)(manager,local_50);
        std::__cxx11::string::~string(local_50);
      }
      operator_delete__(__ptr);
    }
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int DataContainer::GetTypeFromFile(ITypeManager* manager)
{
   FILE* f;
   int ret = GetTypeFromZippedFile(manager);
   if (ret != 0)
   {
      return ret;
   }
   if (fopen_s(&f, current_path_.c_str(), "rb") == 0)
   {
      fseek(f, 0, SEEK_END);
      const long size = ftell(f);
      rewind(f);

      auto* header = new unsigned char[size];

      fread(header, size, 1, f);
      fclose(f);

      // Anything from the buffer ?
      ret = manager->GetTypeFromBuffer(header, size);

      // No, check with name
      if (ret == 0)
      {
         ret = manager->GetTypeFromFile(current_path_);
      }

      delete []header;
   }
   return ret;
}